

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

uint32 key2hash(hash_table_t *h,char *key)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  byte *pbVar6;
  byte bVar7;
  
  bVar4 = *key;
  if (h->nocase == 0) {
    if (bVar4 != 0) {
      pbVar6 = (byte *)(key + 1);
      uVar2 = 0;
      iVar3 = 0;
      do {
        uVar2 = uVar2 + ((int)(char)bVar4 << ((byte)iVar3 & 0x1f));
        iVar5 = iVar3 + 5;
        bVar1 = iVar3 < 0x14;
        iVar3 = iVar3 + -0x13;
        if (bVar1) {
          iVar3 = iVar5;
        }
        bVar4 = *pbVar6;
        pbVar6 = pbVar6 + 1;
      } while (bVar4 != 0);
      goto LAB_001092c8;
    }
  }
  else if (bVar4 != 0) {
    pbVar6 = (byte *)(key + 1);
    uVar2 = 0;
    iVar3 = 0;
    do {
      bVar7 = bVar4 - 0x20;
      if (0x19 < (byte)(bVar4 + 0x9f)) {
        bVar7 = bVar4;
      }
      uVar2 = uVar2 + ((uint)bVar7 << ((byte)iVar3 & 0x1f));
      iVar5 = iVar3 + 5;
      bVar1 = iVar3 < 0x14;
      iVar3 = iVar3 + -0x13;
      if (bVar1) {
        iVar3 = iVar5;
      }
      bVar4 = *pbVar6;
      pbVar6 = pbVar6 + 1;
    } while (bVar4 != 0);
    goto LAB_001092c8;
  }
  uVar2 = 0;
LAB_001092c8:
  return uVar2 % (uint)h->size;
}

Assistant:

static uint32
key2hash(hash_table_t * h, const char *key)
{

    register const char *cp;

    /* This is a hack because the best way to solve it is to make sure 
       all character representation is unsigned character in the first place.        
       (or better unicode.) */
    register unsigned char c;
    register int32 s;
    register uint32 hash;

    hash = 0;
    s = 0;

    if (h->nocase) {
        for (cp = key; *cp; cp++) {
            c = *cp;
            c = UPPER_CASE(c);
            hash += c << s;
            s += 5;
            if (s >= 25)
                s -= 24;
        }
    }
    else {
        for (cp = key; *cp; cp++) {
            hash += (*cp) << s;
            s += 5;
            if (s >= 25)
                s -= 24;
        }
    }

    return (hash % h->size);
}